

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::prepareProgramInput
          (GeometryShaderMaxTextureUnitsTest *this)

{
  ostringstream *this_00;
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ostream *poVar8;
  TestError *this_01;
  long lVar9;
  long lVar10;
  undefined1 local_338 [16];
  TestLog local_328 [13];
  ios_base local_2c0 [264];
  stringstream stream;
  undefined1 local_1a8 [376];
  long lVar7;
  
  iVar3 = (*((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  std::
  vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
  ::resize(&this->m_textures,(long)this->m_max_texture_units);
  if (0 < this->m_max_texture_units) {
    iVar3 = 1;
    lVar10 = 4;
    lVar9 = 0;
    do {
      *(int *)((long)&((this->m_textures).
                       super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
                       ._M_impl.super__Vector_impl_data._M_start)->texture_id + lVar10) = iVar3;
      (**(code **)(lVar7 + 0x6f8))(1);
      (**(code **)(lVar7 + 0xb8))
                (0xde1,*(undefined4 *)
                        ((long)(this->m_textures).
                               super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar10 + -4));
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Failed to create texture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x991);
      (**(code **)(lVar7 + 0x1310))
                (0xde1,0,0x8235,1,1,0,0x8d94,0x1404,
                 (long)&((this->m_textures).
                         super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
                         ._M_impl.super__Vector_impl_data._M_start)->texture_id + lVar10);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2600);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Failed to create storage and fill texture with data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0x99a);
      lVar9 = lVar9 + 1;
      iVar3 = iVar3 + 2;
      lVar10 = lVar10 + 8;
    } while (lVar9 < this->m_max_texture_units);
  }
  if (0 < this->m_max_texture_units) {
    iVar3 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_texture[",0xb);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      pcVar2 = *(code **)(lVar7 + 0xb48);
      GVar1 = (this->super_GeometryShaderLimitsRenderingBase).m_program_object_id;
      std::__cxx11::stringbuf::str();
      iVar5 = (*pcVar2)(GVar1,local_338._0_8_);
      if ((TestLog *)local_338._0_8_ != local_328) {
        operator_delete((void *)local_338._0_8_,(ulong)((long)&(local_328[0].m_log)->flags + 1));
      }
      if (iVar5 == -1) {
LAB_00d0f3a1:
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Failed to get uniform isampler2D location",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                   ,0x9aa);
LAB_00d0f3cc:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      iVar6 = (**(code **)(lVar7 + 0x800))();
      if (iVar6 != 0) goto LAB_00d0f3a1;
      (**(code **)(lVar7 + 0x14f0))(iVar5,iVar3);
      iVar6 = (**(code **)(lVar7 + 0x800))();
      if (iVar6 != 0) {
        local_338._0_8_ =
             ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Failed to set uniform at location: ",0x23);
        std::ostream::operator<<(this_00,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," to value: ",0xb);
        std::ostream::operator<<(this_00,iVar3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2c0);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Failed to get uniform isampler2D location",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                   ,0x9b5);
        goto LAB_00d0f3cc;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->m_max_texture_units);
  }
  if (0 < this->m_max_texture_units) {
    lVar9 = 0;
    do {
      (**(code **)(lVar7 + 8))((int)lVar9 + 0x84c0);
      (**(code **)(lVar7 + 0xb8))
                (0xde1,(this->m_textures).
                       super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar9].texture_id);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->m_max_texture_units);
  }
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Failed to set texture units up",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x9c0);
  return;
}

Assistant:

void GeometryShaderMaxTextureUnitsTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_textures.resize(m_max_texture_units);

	/* Prepare texture storage and fill data */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		/* (starting from 1, delta: 2) */
		m_textures[i].data = i * 2 + 1;

		/* Generate and bind texture */
		gl.genTextures(1, &m_textures[i].texture_id);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create texture");

		/* Allocate and upload texture data */
		gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R32I, 1 /* width */, 1 /* height */, 0 /* border */,
					  GL_RED_INTEGER, GL_INT, &m_textures[i].data);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create storage and fill texture with data");
	}

	/* Prepare sampler uniforms */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		/* Prepare name of sampler */
		std::stringstream stream;

		stream << "gs_texture[" << i << "]";

		/* Get sampler location */
		glw::GLint gs_texture_location = gl.getUniformLocation(m_program_object_id, stream.str().c_str());

		if (-1 == gs_texture_location || (GL_NO_ERROR != gl.getError()))
		{
			TCU_FAIL("Failed to get uniform isampler2D location");
		}

		/* Set uniform at sampler location value to index of texture unit */
		gl.uniform1i(gs_texture_location, i);

		if (GL_NO_ERROR != gl.getError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to set uniform at location: " << gs_texture_location
							   << " to value: " << i << tcu::TestLog::EndMessage;

			TCU_FAIL("Failed to get uniform isampler2D location");
		}
	}

	/* Bind textures to texture units */
	for (int i = 0; i < m_max_texture_units; ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set texture units up");
}